

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O2

void tcu::anon_unknown_0::EtcDecompressInternal::decompressEAC11Block
               (deUint8 *dst,deUint64 src,bool signedMode)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  undefined3 in_register_00000011;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  
  uVar3 = (uint)(src >> 0x34) & 0xf;
  bVar2 = (byte)(src >> 0x38);
  uVar6 = (uint)bVar2;
  if (CONCAT31(in_register_00000011,signedMode) != 0) {
    uVar7 = bVar2 - 0x100;
    if (-1 < (long)src) {
      uVar7 = (uint)bVar2;
    }
    uVar6 = 0xffffff81;
    if (uVar7 != 0xffffff80) {
      uVar6 = uVar7;
    }
  }
  iVar8 = 1;
  if (uVar3 != 0) {
    iVar8 = uVar3 * 8;
  }
  uVar7 = 0;
  uVar9 = 0;
  for (uVar5 = 0x2d; uVar5 != 0xfffffffffffffffd; uVar5 = uVar5 - 3) {
    iVar1 = *(int *)((long)decompressEAC11Block::modifierTable[0] +
                    (ulong)((uint)((src >> (uVar5 & 0x3f) & 1) != 0) +
                            ((uint)(src >> ((char)uVar5 + 1U & 0x3f)) & 1) * 2 +
                           ((uint)(src >> ((char)uVar5 + 2U & 0x3f)) & 1) * 4) * 4 +
                    (ulong)(((ushort)(src >> 0x30) & 0xf) << 5));
    if (signedMode) {
      iVar4 = (iVar1 * uVar3 + uVar6) * 8;
      if (uVar3 == 0) {
        iVar4 = iVar1 + uVar6 * 8;
      }
      if (0x3fe < iVar4) {
        iVar4 = 0x3ff;
      }
      if (iVar4 < -0x3fe) {
        iVar4 = -0x3ff;
      }
    }
    else {
      iVar4 = iVar1 * iVar8 + uVar6 * 8 + 4;
      if (0x7fe < iVar4) {
        iVar4 = 0x7ff;
      }
      if (iVar4 < 1) {
        iVar4 = 0;
      }
    }
    *(short *)(dst + (ulong)(uVar9 & 0xc | uVar7 >> 2) * 2) = (short)iVar4;
    uVar9 = uVar9 + 4;
    uVar7 = uVar7 + 1;
  }
  return;
}

Assistant:

inline deUint32 getBits (deUint64 src, int low, int high)
{
	const int numBits = (high-low) + 1;
	DE_ASSERT(de::inRange(numBits, 1, 32));
	if (numBits < 32)
		return (deUint32)((src >> low) & ((1u<<numBits)-1));
	else
		return (deUint32)((src >> low) & 0xFFFFFFFFu);
}